

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O0

void finish(cs_active *data)

{
  v_array<unsigned_long>::delete_v((v_array<unsigned_long> *)data);
  return;
}

Assistant:

void finish(cs_active& data) { data.examples_by_queries.delete_v(); }